

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcUShapeProfileDef::IfcUShapeProfileDef(IfcUShapeProfileDef *this)

{
  IfcUShapeProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xe0,"IfcUShapeProfileDef");
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__00f84800);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcUShapeProfileDef,_8UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcUShapeProfileDef,_8UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,
             &PTR_construction_vtable_24__00f84848);
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf84770;
  *(undefined8 *)&this->field_0xe0 = 0xf847e8;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0xf84798
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0xf847c0;
  STEP::Maybe<double>::Maybe(&this->FilletRadius);
  STEP::Maybe<double>::Maybe(&this->EdgeRadius);
  STEP::Maybe<double>::Maybe(&this->FlangeSlope);
  STEP::Maybe<double>::Maybe(&this->CentreOfGravityInX);
  return;
}

Assistant:

IfcUShapeProfileDef() : Object("IfcUShapeProfileDef") {}